

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int in_ECX;
  int in_R8D;
  int in_XMM0_Da;
  __va_list_tag *in_XMM1_Qb;
  char *in_XMM2_Qa;
  stbi__write_context *in_XMM2_Qb;
  int in_stack_00000008;
  undefined4 in_stack_00000020;
  va_list v;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  stbi__write_context *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  __va_list_tag *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  stbi__write_context *in_stack_ffffffffffffff60;
  undefined4 local_c;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff50 = in_XMM1_Qb;
    in_stack_ffffffffffffff58 = in_XMM2_Qa;
    in_stack_ffffffffffffff60 = in_XMM2_Qb;
    in_stack_ffffffffffffff38 = in_XMM0_Da;
  }
  if ((in_R8D < 0) || (in_ECX < 0)) {
    local_c = 0;
  }
  else {
    stbiw__writefv(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    stbiw__write_pixels(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                        in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_00000008,
                        in_stack_fffffffffffffefc,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff38);
    local_c = 1;
  }
  return local_c;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}